

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_get_file_attributes.c
# Opt level: O3

int zip_source_get_file_attributes(zip_source_t *src,zip_file_attributes_t *attributes)

{
  int iVar1;
  zip_int64_t zVar2;
  byte bVar3;
  zip_file_attributes_t lower_attributes;
  zip_file_attributes_t local_30;
  
  if (src->source_closed != false) {
    return -1;
  }
  if (attributes == (zip_file_attributes_t *)0x0) {
    zip_error_set(&src->error,0x12,0);
  }
  else {
    attributes->valid = 0;
    attributes->version = '\x01';
    if (((src->supports & 0x80000) != 0) &&
       (zVar2 = _zip_source_call(src,attributes,0x18,ZIP_SOURCE_GET_FILE_ATTRIBUTES), zVar2 < 0)) {
      return -1;
    }
    if (src->src == (zip_source_t *)0x0) {
      return 0;
    }
    iVar1 = zip_source_get_file_attributes(src->src,&local_30);
    if (-1 < iVar1) {
      if (((local_30.valid & 1) != 0) && ((attributes->valid & 1) == 0)) {
        attributes->host_system = local_30.host_system;
        attributes->valid = attributes->valid | 1;
      }
      if (((local_30.valid & 2) != 0) && ((attributes->valid & 2) == 0)) {
        attributes->ascii = local_30.ascii;
        attributes->valid = attributes->valid | 2;
      }
      if ((local_30.valid & 4) != 0) {
        if ((attributes->valid & 4) == 0) {
          attributes->version_needed = local_30.version_needed;
          attributes->valid = attributes->valid | 4;
        }
        else {
          bVar3 = attributes->version_needed;
          if (attributes->version_needed < local_30.version_needed) {
            bVar3 = local_30.version_needed;
          }
          attributes->version_needed = bVar3;
        }
      }
      if (((local_30.valid & 8) != 0) && ((attributes->valid & 8) == 0)) {
        attributes->external_file_attributes = local_30.external_file_attributes;
        attributes->valid = attributes->valid | 8;
      }
      if ((local_30.valid & 0x10) == 0) {
        return 0;
      }
      if ((attributes->valid & 0x10) == 0) {
        attributes->valid = attributes->valid | 0x10;
        attributes->general_purpose_bit_flags = local_30.general_purpose_bit_flags;
        attributes->general_purpose_bit_mask = local_30.general_purpose_bit_mask;
        return 0;
      }
      attributes->general_purpose_bit_flags =
           attributes->general_purpose_bit_flags ^
           (local_30.general_purpose_bit_flags ^ attributes->general_purpose_bit_flags) &
           local_30.general_purpose_bit_mask;
      attributes->general_purpose_bit_mask =
           attributes->general_purpose_bit_mask | local_30.general_purpose_bit_mask;
      return 0;
    }
    _zip_error_set_from_source(&src->error,src->src);
  }
  return -1;
}

Assistant:

int
zip_source_get_file_attributes(zip_source_t *src, zip_file_attributes_t *attributes) {
    if (src->source_closed) {
	return -1;
    }
    if (attributes == NULL) {
	zip_error_set(&src->error, ZIP_ER_INVAL, 0);
	return -1;
    }

    zip_file_attributes_init(attributes);

    if (src->supports & ZIP_SOURCE_MAKE_COMMAND_BITMASK(ZIP_SOURCE_GET_FILE_ATTRIBUTES)) {
	if (_zip_source_call(src, attributes, sizeof(*attributes), ZIP_SOURCE_GET_FILE_ATTRIBUTES) < 0) {
	    return -1;
	}
    }

    if (ZIP_SOURCE_IS_LAYERED(src)) {
	zip_file_attributes_t lower_attributes;

	if (zip_source_get_file_attributes(src->src, &lower_attributes) < 0) {
	    _zip_error_set_from_source(&src->error, src->src);
	    return -1;
	}

	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_HOST_SYSTEM) && (attributes->valid & ZIP_FILE_ATTRIBUTES_HOST_SYSTEM) == 0) {
	    attributes->host_system = lower_attributes.host_system;
	    attributes->valid |= ZIP_FILE_ATTRIBUTES_HOST_SYSTEM;
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_ASCII) && (attributes->valid & ZIP_FILE_ATTRIBUTES_ASCII) == 0) {
	    attributes->ascii = lower_attributes.ascii;
	    attributes->valid |= ZIP_FILE_ATTRIBUTES_ASCII;
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_VERSION_NEEDED)) {
	    if (attributes->valid & ZIP_FILE_ATTRIBUTES_VERSION_NEEDED) {
		attributes->version_needed = ZIP_MAX(lower_attributes.version_needed, attributes->version_needed);
	    }
	    else {
		attributes->version_needed = lower_attributes.version_needed;
		attributes->valid |= ZIP_FILE_ATTRIBUTES_VERSION_NEEDED;
	    }
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_EXTERNAL_FILE_ATTRIBUTES) && (attributes->valid & ZIP_FILE_ATTRIBUTES_EXTERNAL_FILE_ATTRIBUTES) == 0) {
	    attributes->external_file_attributes = lower_attributes.external_file_attributes;
	    attributes->valid |= ZIP_FILE_ATTRIBUTES_EXTERNAL_FILE_ATTRIBUTES;
	}
	if ((lower_attributes.valid & ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS)) {
	    if (attributes->valid & ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS) {
		attributes->general_purpose_bit_flags &= ~lower_attributes.general_purpose_bit_mask;
		attributes->general_purpose_bit_flags |= lower_attributes.general_purpose_bit_flags & lower_attributes.general_purpose_bit_mask;
		attributes->general_purpose_bit_mask |= lower_attributes.general_purpose_bit_mask;
	    }
	    else {
		attributes->valid |= ZIP_FILE_ATTRIBUTES_GENERAL_PURPOSE_BIT_FLAGS;
		attributes->general_purpose_bit_flags = lower_attributes.general_purpose_bit_flags;
		attributes->general_purpose_bit_mask = lower_attributes.general_purpose_bit_mask;
	    }
	}
    }

    return 0;
}